

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,optional<long> *rhs)

{
  bool bVar1;
  lest *this_00;
  long lVar2;
  optional<long> *in_R8;
  allocator<char> local_79;
  long local_78;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  bVar1 = (rhs->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_engaged;
  local_78 = (long)*(int *)this_00;
  lVar2 = (rhs->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"!=",&local_79);
  to_string<int,std::optional<long>>(&local_70,this_00,(int *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (bool)(lVar2 != local_78 | bVar1 ^ 1U);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }